

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

Layer * ncnn::create_layer_naive(char *type)

{
  int iVar1;
  Layer *pLVar2;
  undefined **ppuVar3;
  int i;
  ulong uVar4;
  
  ppuVar3 = &PTR_AbsVal_layer_creator_006203d8;
  uVar4 = 0;
  while (iVar1 = strcmp(type,ppuVar3[-1]), iVar1 != 0) {
    uVar4 = uVar4 + 1;
    ppuVar3 = ppuVar3 + 2;
    if (uVar4 == 0x6b) {
      return (Layer *)0x0;
    }
  }
  if (0x6a < uVar4) {
    return (Layer *)0x0;
  }
  iVar1 = (int)uVar4;
  if (iVar1 == 1) {
    return (Layer *)0x0;
  }
  if (iVar1 == 0x22) {
    return (Layer *)0x0;
  }
  pLVar2 = (Layer *)(*(code *)*ppuVar3)(0);
  pLVar2->typeindex = iVar1;
  return pLVar2;
}

Assistant:

Layer* create_layer_naive(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer_naive(index);
}